

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall ParseResult::ParseResult(ParseResult *this,string *s)

{
  string *s_local;
  ParseResult *this_local;
  
  this->result = ERROR;
  std::shared_ptr<ASTNode>::shared_ptr(&this->node,(nullptr_t)0x0);
  std::__cxx11::string::string((string *)&this->error,(string *)s);
  return;
}

Assistant:

explicit ParseResult(const std::string &s): result(parse_result_t::ERROR), node(nullptr), error(s) {}